

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegtexture.cpp
# Opt level: O3

int __thiscall
FJPEGTexture::CopyTrueColorPixels
          (FJPEGTexture *this,FBitmap *bmp,int x,int y,int rotate,FCopyInfo *inf)

{
  void *pvVar1;
  long lVar2;
  undefined8 uVar3;
  undefined4 *puVar4;
  int iVar5;
  undefined8 uVar6;
  JDIMENSION JVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  BYTE *ptr;
  FWadLump lump;
  jpeg_decompress_struct cinfo;
  jpeg_error_mgr jerr;
  PalEntry pe [256];
  FLumpSourceMgr sourcemgr;
  
  FWadCollection::OpenLumpNum(&lump,&Wads,(this->super_FTexture).SourceLump);
  cinfo.err = (jpeg_error_mgr *)jpeg_std_error(&jerr);
  (cinfo.err)->output_message = JPEG_OutputMessage;
  (cinfo.err)->error_exit = JPEG_ErrorExit;
  jpeg_CreateDecompress(&cinfo,0x50,0x290);
  cinfo.src = &sourcemgr.super_jpeg_source_mgr;
  sourcemgr.super_jpeg_source_mgr.init_source = FLumpSourceMgr::InitSource;
  sourcemgr.super_jpeg_source_mgr.fill_input_buffer = FLumpSourceMgr::FillInputBuffer;
  sourcemgr.super_jpeg_source_mgr.skip_input_data = FLumpSourceMgr::SkipInputData;
  sourcemgr.super_jpeg_source_mgr.resync_to_restart = jpeg_resync_to_restart;
  sourcemgr.super_jpeg_source_mgr.term_source = FLumpSourceMgr::TermSource;
  sourcemgr.super_jpeg_source_mgr.next_input_byte = (JOCTET *)0x0;
  sourcemgr.super_jpeg_source_mgr.bytes_in_buffer = 0;
  sourcemgr.Lump = &lump.super_FileReader;
  jpeg_read_header(&cinfo,1);
  if (cinfo.num_components != 3 || cinfo.out_color_space != JCS_RGB) {
    if ((cinfo.num_components != 4 || cinfo.out_color_space != JCS_CMYK) &&
       ((cinfo.out_color_space != JCS_GRAYSCALE || (cinfo.num_components != 1)))) {
      Printf("\x1cIUnsupported color format\n");
      puVar4 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar4 = 0xffffffff;
      __cxa_throw(puVar4,&int::typeinfo,0);
    }
  }
  jpeg_start_decompress(&cinfo);
  JVar7 = cinfo.output_height;
  pvVar1 = operator_new__((ulong)(cinfo.output_width * cinfo.output_height * cinfo.output_components
                                 ));
  if (cinfo.output_scanline < JVar7) {
    iVar5 = 0;
    do {
      ptr = (BYTE *)((ulong)(cinfo.output_width * iVar5 * cinfo.output_components) + (long)pvVar1);
      jpeg_read_scanlines(&cinfo,&ptr,1);
      iVar5 = iVar5 + 1;
      JVar7 = cinfo.output_height;
    } while (cinfo.output_scanline < cinfo.output_height);
  }
  if (cinfo.out_color_space == JCS_CMYK) {
    uVar3 = 4;
    uVar6 = 4;
  }
  else {
    if (cinfo.out_color_space != JCS_RGB) {
      if (cinfo.out_color_space != JCS_GRAYSCALE) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/textures/jpegtexture.cpp"
                      ,0x210,
                      "virtual int FJPEGTexture::CopyTrueColorPixels(FBitmap *, int, int, int, FCopyInfo *)"
                     );
      }
      lVar2 = 0;
      auVar8 = _DAT_00740a10;
      do {
        pe[lVar2].field_0 =
             (anon_union_4_2_12391d7c_for_PalEntry_0)(auVar8._0_4_ * 0x10101 + (int)DAT_0074c100);
        pe[lVar2 + 1].field_0 =
             (anon_union_4_2_12391d7c_for_PalEntry_0)(auVar8._4_4_ * 0x10101 + DAT_0074c100._4_4_);
        pe[lVar2 + 2].field_0 =
             (anon_union_4_2_12391d7c_for_PalEntry_0)
             ((int)((auVar8._8_8_ & 0xffffffff) * 0x10101) + DAT_0074c100._8_4_);
        pe[lVar2 + 3].field_0 =
             (anon_union_4_2_12391d7c_for_PalEntry_0)(auVar8._12_4_ * 0x10101 + DAT_0074c100._12_4_)
        ;
        lVar2 = lVar2 + 4;
        auVar9._0_4_ = auVar8._0_4_ + (int)DAT_00740a60;
        auVar9._4_4_ = auVar8._4_4_ + DAT_00740a60._4_4_;
        auVar9._8_4_ = auVar8._8_4_ + DAT_00740a60._8_4_;
        auVar9._12_4_ = auVar8._12_4_ + DAT_00740a60._12_4_;
        auVar8 = auVar9;
      } while (lVar2 != 0x100);
      (*bmp->_vptr_FBitmap[3])
                (bmp,(ulong)(uint)x,(ulong)(uint)y,pvVar1,(ulong)cinfo.output_width,(ulong)JVar7,1,
                 (ulong)cinfo.output_width,(ulong)(uint)rotate,pe,inf);
      goto LAB_00658fb6;
    }
    uVar6 = 0;
    uVar3 = 3;
  }
  (*bmp->_vptr_FBitmap[2])
            (bmp,(ulong)(uint)x,(ulong)(uint)y,pvVar1,(ulong)cinfo.output_width,(ulong)JVar7,uVar3,
             (ulong)(cinfo.output_components * cinfo.output_width),(ulong)(uint)rotate,uVar6,inf,0,0
             ,0);
LAB_00658fb6:
  jpeg_finish_decompress(&cinfo);
  jpeg_destroy_decompress(&cinfo);
  if (pvVar1 != (void *)0x0) {
    operator_delete__(pvVar1);
  }
  FWadLump::~FWadLump(&lump);
  return 0;
}

Assistant:

int FJPEGTexture::CopyTrueColorPixels(FBitmap *bmp, int x, int y, int rotate, FCopyInfo *inf)
{
	PalEntry pe[256];

	FWadLump lump = Wads.OpenLumpNum (SourceLump);
	JSAMPLE *buff = NULL;

	jpeg_decompress_struct cinfo;
	jpeg_error_mgr jerr;

	cinfo.err = jpeg_std_error(&jerr);
	cinfo.err->output_message = JPEG_OutputMessage;
	cinfo.err->error_exit = JPEG_ErrorExit;
	jpeg_create_decompress(&cinfo);

	try
	{
		FLumpSourceMgr sourcemgr(&lump, &cinfo);
		jpeg_read_header(&cinfo, TRUE);

		if (!((cinfo.out_color_space == JCS_RGB && cinfo.num_components == 3) ||
			  (cinfo.out_color_space == JCS_CMYK && cinfo.num_components == 4) ||
			  (cinfo.out_color_space == JCS_GRAYSCALE && cinfo.num_components == 1)))
		{
			Printf (TEXTCOLOR_ORANGE "Unsupported color format\n");
			throw -1;
		}
		jpeg_start_decompress(&cinfo);

		int yc = 0;
		buff = new BYTE[cinfo.output_height * cinfo.output_width * cinfo.output_components];


		while (cinfo.output_scanline < cinfo.output_height)
		{
			BYTE * ptr = buff + cinfo.output_width * cinfo.output_components * yc;
			jpeg_read_scanlines(&cinfo, &ptr, 1);
			yc++;
		}

		switch (cinfo.out_color_space)
		{
		case JCS_RGB:
			bmp->CopyPixelDataRGB(x, y, buff, cinfo.output_width, cinfo.output_height, 
				3, cinfo.output_width * cinfo.output_components, rotate, CF_RGB, inf);
			break;

		case JCS_GRAYSCALE:
			for(int i=0;i<256;i++) pe[i]=PalEntry(255,i,i,i);	// default to a gray map
			bmp->CopyPixelData(x, y, buff, cinfo.output_width, cinfo.output_height, 
				1, cinfo.output_width, rotate, pe, inf);
			break;

		case JCS_CMYK:
			bmp->CopyPixelDataRGB(x, y, buff, cinfo.output_width, cinfo.output_height, 
				4, cinfo.output_width * cinfo.output_components, rotate, CF_CMYK, inf);
			break;

		default:
			assert(0);
			break;
		}
		jpeg_finish_decompress(&cinfo);
	}
	catch(int)
	{
		Printf (TEXTCOLOR_ORANGE "   in JPEG texture %s\n", Name.GetChars());
	}
	jpeg_destroy_decompress(&cinfo);
	if (buff != NULL) delete [] buff;
	return 0;
}